

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

null_terminating_iterator<wchar_t> __thiscall
fmt::v5::internal::
parse_format_specs<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
          (internal *this,null_terminating_iterator<wchar_t> it,
          specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
          *handler)

{
  wchar_t wVar1;
  wchar_t wVar2;
  alignment align;
  bool bVar3;
  uint uVar4;
  internal *piVar5;
  basic_format_specs<wchar_t> *handler_00;
  bool bVar6;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *this_00;
  long lVar7;
  char *message;
  internal *this_01;
  null_terminating_iterator<wchar_t> nVar8;
  null_terminating_iterator<wchar_t> nVar9;
  null_terminating_iterator<wchar_t> nVar10;
  null_terminating_iterator<wchar_t> local_30;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *local_20;
  
  this_00 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
             *)it.end_;
  nVar10.ptr_ = (internal *)it.ptr_;
  if (((this == nVar10.ptr_) || (wVar1 = *(wchar_t *)this, wVar1 == L'\0')) || (wVar1 == L'}'))
  goto LAB_00124e66;
  lVar7 = 1;
  handler_00 = (basic_format_specs<wchar_t> *)0x0;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    local_30.ptr_ = (wchar_t *)this;
    local_30.end_ = (wchar_t *)nVar10.ptr_;
    if (this + lVar7 * 4 != nVar10.ptr_) {
      wVar2 = *(wchar_t *)(this + lVar7 * 4);
      if (wVar2 == L'<') {
        align = ALIGN_LEFT;
      }
      else if (wVar2 == L'^') {
        align = ALIGN_CENTER;
      }
      else if (wVar2 == L'>') {
        align = ALIGN_RIGHT;
      }
      else {
        if (wVar2 != L'=') goto LAB_00124e9f;
        align = ALIGN_NUMERIC;
      }
      if (handler_00 == (basic_format_specs<wchar_t> *)0x0) {
        if (wVar1 == L'{') {
          specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ::on_error((specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                      *)this_00,"invalid fill character \'{\'");
          goto LAB_00124e66;
        }
        this = this + 8;
        handler_00 = (this_00->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                     ).super_specs_setter<wchar_t>.specs_;
        (handler_00->super_align_spec).fill_ = wVar1;
      }
      else {
        this = this + 4;
      }
      local_30.ptr_ = (wchar_t *)this;
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
      ::on_align(this_00,align);
      break;
    }
LAB_00124e9f:
    handler_00 = (basic_format_specs<wchar_t> *)0x1;
    lVar7 = 0;
    bVar3 = false;
  } while (bVar6);
  if (this != nVar10.ptr_) {
    wVar1 = *(wchar_t *)this;
    if (wVar1 == L' ') {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
      ::on_space(this_00);
    }
    else if (wVar1 == L'-') {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
      ::on_minus(this_00);
    }
    else {
      if (wVar1 != L'+') goto LAB_00124f37;
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
      ::on_plus(this_00);
    }
    this = this + 4;
    local_30.ptr_ = (wchar_t *)this;
  }
LAB_00124f37:
  if ((this != nVar10.ptr_) && (*(wchar_t *)this == L'#')) {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
    ::on_hash(this_00);
    this = this + 4;
    local_30.ptr_ = (wchar_t *)this;
  }
  if ((this != nVar10.ptr_) && (*(wchar_t *)this == L'0')) {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
    ::on_zero(this_00);
    this = this + 4;
    local_30.ptr_ = (wchar_t *)this;
  }
  if ((this == nVar10.ptr_) || (wVar1 = *(wchar_t *)this, wVar1 < L'0')) {
LAB_00124fde:
    local_30.ptr_ = (wchar_t *)this;
    if (((internal *)local_30.ptr_ != nVar10.ptr_) && (*local_30.ptr_ == L'.')) {
      piVar5 = (internal *)((long)local_30.ptr_ + 4);
      if ((piVar5 == nVar10.ptr_) || (wVar1 = *(wchar_t *)piVar5, wVar1 < L'0')) {
LAB_00125099:
        message = "missing precision specifier";
        local_30.ptr_ = (wchar_t *)piVar5;
        goto LAB_001250a0;
      }
      if ((uint)wVar1 < 0x3a) {
        local_30.ptr_ = (wchar_t *)piVar5;
        uVar4 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                          (&local_30,this_00);
        ((this_00->
         super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
         ).super_specs_setter<wchar_t>.specs_)->precision_ = uVar4;
      }
      else {
        if (wVar1 != L'{') goto LAB_00125099;
        this_01 = (internal *)((long)local_30.ptr_ + 8);
        nVar9.end_ = (wchar_t *)&local_20;
        nVar9.ptr_ = (wchar_t *)nVar10.ptr_;
        local_30.ptr_ = (wchar_t *)piVar5;
        local_20 = this_00;
        nVar10 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                           (this_01,nVar9,
                            (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                             *)handler_00);
        local_30.end_ = nVar10.end_;
        local_30.ptr_ = (wchar_t *)(nVar10.ptr_ + 4);
        if ((nVar10.ptr_ == (internal *)local_30.end_) || (*(wchar_t *)nVar10.ptr_ != L'}'))
        goto LAB_00125090;
      }
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
      ::end_precision(this_00);
      nVar10.ptr_ = (internal *)local_30.end_;
    }
    this = (internal *)local_30.ptr_;
    if ((((internal *)local_30.ptr_ != nVar10.ptr_) && (wVar1 = *local_30.ptr_, wVar1 != L'\0')) &&
       (wVar1 != L'}')) {
      this = (internal *)((long)local_30.ptr_ + 4);
      ((this_00->
       super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
       ).super_specs_setter<wchar_t>.specs_)->type_ = wVar1;
    }
  }
  else {
    if ((uint)wVar1 < 0x3a) {
      uVar4 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                        (&local_30,this_00);
      handler_00 = (this_00->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ).super_specs_setter<wchar_t>.specs_;
      (handler_00->super_align_spec).width_ = uVar4;
      nVar10.ptr_ = (internal *)local_30.end_;
      this = (internal *)local_30.ptr_;
      goto LAB_00124fde;
    }
    if (wVar1 != L'{') goto LAB_00124fde;
    nVar10.end_ = (wchar_t *)&local_20;
    local_20 = this_00;
    nVar9 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                      (this + 4,nVar10,
                       (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                        *)handler_00);
    nVar10.ptr_ = (internal *)nVar9.end_;
    piVar5 = (internal *)nVar9.ptr_;
    local_30.ptr_ = (wchar_t *)(piVar5 + 4);
    local_30.end_ = (wchar_t *)nVar10.ptr_;
    if ((piVar5 != nVar10.ptr_) && (this = (internal *)local_30.ptr_, *(wchar_t *)piVar5 == L'}'))
    goto LAB_00124fde;
LAB_00125090:
    message = "invalid format string";
LAB_001250a0:
    specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::on_error((specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                *)this_00,message);
    nVar10.ptr_ = (internal *)local_30.end_;
    this = (internal *)local_30.ptr_;
  }
LAB_00124e66:
  nVar8.end_ = (wchar_t *)nVar10.ptr_;
  nVar8.ptr_ = (wchar_t *)this;
  return nVar8;
}

Assistant:

FMT_CONSTEXPR Iterator parse_format_specs(Iterator it, SpecHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || !c)
    return it;

  // Parse fill and alignment.
  alignment align = ALIGN_DEFAULT;
  int i = 1;
  do {
    auto p = it + i;
    switch (*p) {
      case '<':
        align = ALIGN_LEFT;
        break;
      case '>':
        align = ALIGN_RIGHT;
        break;
      case '=':
        align = ALIGN_NUMERIC;
        break;
      case '^':
        align = ALIGN_CENTER;
        break;
    }
    if (align != ALIGN_DEFAULT) {
      if (p != it) {
        if (c == '{') {
          handler.on_error("invalid fill character '{'");
          return it;
        }
        it += 2;
        handler.on_fill(c);
      } else ++it;
      handler.on_align(align);
      break;
    }
  } while (--i >= 0);

  // Parse sign.
  switch (*it) {
    case '+':
      handler.on_plus();
      ++it;
      break;
    case '-':
      handler.on_minus();
      ++it;
      break;
    case ' ':
      handler.on_space();
      ++it;
      break;
  }

  if (*it == '#') {
    handler.on_hash();
    ++it;
  }

  // Parse zero flag.
  if (*it == '0') {
    handler.on_zero();
    ++it;
  }

  // Parse width.
  if ('0' <= *it && *it <= '9') {
    handler.on_width(parse_nonnegative_int(it, handler));
  } else if (*it == '{') {
    it = parse_arg_id(it + 1, width_adapter<SpecHandler, char_type>(handler));
    if (*it++ != '}') {
      handler.on_error("invalid format string");
      return it;
    }
  }

  // Parse precision.
  if (*it == '.') {
    ++it;
    if ('0' <= *it && *it <= '9') {
      handler.on_precision(parse_nonnegative_int(it, handler));
    } else if (*it == '{') {
      it = parse_arg_id(
            it + 1, precision_adapter<SpecHandler, char_type>(handler));
      if (*it++ != '}') {
        handler.on_error("invalid format string");
        return it;
      }
    } else {
      handler.on_error("missing precision specifier");
      return it;
    }
    handler.end_precision();
  }

  // Parse type.
  if (*it != '}' && *it)
    handler.on_type(*it++);
  return it;
}